

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::ReduceSumSquareLayerParams::MergePartialFromCodedStream
          (ReduceSumSquareLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  char cVar10;
  ulong uVar11;
  pair<unsigned_long,_bool> pVar12;
  pair<unsigned_long,_bool> pVar13;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003be78d;
      input->buffer_ = pbVar3 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003be78d:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    iVar8 = 6;
    iVar9 = iVar8;
    if ((uVar11 & 0x100000000) == 0) {
LAB_003be7ae:
      iVar9 = 7;
      if ((uVar6 & 7) != 4 && uVar6 != 0) {
        bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_003be7cc:
        iVar9 = iVar8;
        if (bVar5 != false) goto LAB_003be7d3;
      }
    }
    else {
      uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar10 = (char)uVar11;
      if (uVar7 == 3) {
        if (cVar10 != '\x18') goto LAB_003be7ae;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar13._8_8_ = 1;
          pVar13.first = (long)(char)uVar2;
        }
        else {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_003be7d5;
        this->reduceall_ = pVar13.first != 0;
LAB_003be7d3:
        iVar9 = 0;
      }
      else {
        if (uVar7 != 2) {
          if (uVar7 != 1) goto LAB_003be7ae;
          if (cVar10 == '\b') {
            bVar5 = google::protobuf::internal::WireFormatLite::
                    ReadRepeatedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                              (1,10,input,&this->axes_);
          }
          else {
            if ((uVar6 & 0xff) != 10) goto LAB_003be7ae;
            bVar5 = google::protobuf::internal::WireFormatLite::
                    ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                              (input,&this->axes_);
          }
          goto LAB_003be7cc;
        }
        if (cVar10 != '\x10') goto LAB_003be7ae;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar12._8_8_ = 1;
          pVar12.first = (long)(char)uVar2;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          this->keepdims_ = pVar12.first != 0;
          goto LAB_003be7d3;
        }
      }
    }
LAB_003be7d5:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool ReduceSumSquareLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ReduceSumSquareLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 axes = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_axes())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_axes())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool keepDims = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &keepdims_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reduceAll = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reduceall_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ReduceSumSquareLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ReduceSumSquareLayerParams)
  return false;
#undef DO_
}